

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_grow(bitset_t *bitset,size_t newarraysize)

{
  long lVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  uint64_t *puVar5;
  
  _Var3 = false;
  if ((newarraysize >> 0x3a == 0) && (_Var3 = false, bitset->arraysize <= newarraysize)) {
    if (bitset->capacity < newarraysize) {
      lVar1 = 0x3f;
      if (newarraysize != 0) {
        for (; newarraysize >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar2 = (0xffffffffffffffffU >> (~(byte)lVar1 & 0x3f)) + 1;
      do {
        uVar4 = uVar2;
        uVar2 = uVar4 * 2;
      } while (uVar4 < newarraysize);
      puVar5 = (uint64_t *)roaring_realloc(bitset->array,uVar4 * 8);
      if (puVar5 == (uint64_t *)0x0) {
        return false;
      }
      bitset->capacity = uVar4;
      bitset->array = puVar5;
    }
    memset(bitset->array + bitset->arraysize,0,(newarraysize - bitset->arraysize) * 8);
    bitset->arraysize = newarraysize;
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

bool bitset_grow(bitset_t *bitset, size_t newarraysize) {
    if (newarraysize < bitset->arraysize) {
        return false;
    }
    if (newarraysize > SIZE_MAX / 64) {
        return false;
    }
    if (bitset->capacity < newarraysize) {
        uint64_t *newarray;
        size_t newcapacity = (UINT64_C(0xFFFFFFFFFFFFFFFF) >>
                              roaring_leading_zeroes(newarraysize)) +
                             1;
        while (newcapacity < newarraysize) {
            newcapacity *= 2;
        }
        if ((newarray = (uint64_t *)roaring_realloc(
                 bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
            return false;
        }
        bitset->capacity = newcapacity;
        bitset->array = newarray;
    }
    memset(bitset->array + bitset->arraysize, 0,
           sizeof(uint64_t) * (newarraysize - bitset->arraysize));
    bitset->arraysize = newarraysize;
    return true;  // success!
}